

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O2

void Assimp::IFC::ProcessConnectedFaceSet
               (IfcConnectedFaceSet *fset,TempMesh *result,ConversionData *conv)

{
  Lazy *pLVar1;
  Lazy *pLVar2;
  IfcFace *pIVar3;
  IfcFaceBound *pIVar4;
  IfcLoop *pIVar5;
  IfcPolyLoop *loop;
  Lazy *this;
  ConversionData *extraout_RDX;
  undefined1 *this_00;
  Lazy *this_01;
  TempMesh meshout;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [376];
  
  pLVar1 = *(Lazy **)&fset->field_0x38;
  for (this = *(Lazy **)&(fset->super_IfcTopologicalRepresentationItem).field_0x30; this != pLVar1;
      this = this + 8) {
    pIVar3 = STEP::Lazy::operator_cast_to_IfcFace_(this);
    meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    meshout.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar2 = *(Lazy **)&pIVar3->field_0x38;
    for (this_01 = *(Lazy **)&(pIVar3->super_IfcTopologicalRepresentationItem).field_0x30;
        this_01 != pLVar2; this_01 = this_01 + 8) {
      pIVar4 = STEP::Lazy::operator_cast_to_IfcFaceBound_(this_01);
      this_00 = &(pIVar4->super_IfcTopologicalRepresentationItem).field_0x30;
      pIVar5 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>::operator->
                         ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)this_00);
      loop = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPolyLoop>
                       ((Object *)
                        ((long)&(pIVar5->super_IfcTopologicalRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper +
                        (long)(pIVar5->super_IfcTopologicalRepresentationItem).
                              super_IfcRepresentationItem.
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper[-3]));
      if (loop == (IfcPolyLoop *)0x0) {
        pIVar5 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>::operator->
                           ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)this_00);
        STEP::Object::GetClassName_abi_cxx11_
                  (&local_1e8,
                   (Object *)
                   ((long)&(pIVar5->super_IfcTopologicalRepresentationItem).
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           _vptr_ObjectHelper +
                   (long)(pIVar5->super_IfcTopologicalRepresentationItem).
                         super_IfcRepresentationItem.
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                         _vptr_ObjectHelper[-3]));
        std::operator+(&local_1c8,"skipping unknown IfcFaceBound entity, type is ",&local_1e8);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>(local_1a8,&local_1c8);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      else {
        ProcessPolyloop(loop,&meshout,extraout_RDX);
      }
    }
    ProcessPolygonBoundaries(result,&meshout,0xffffffffffffffff);
    TempMesh::~TempMesh(&meshout);
  }
  return;
}

Assistant:

void ProcessConnectedFaceSet(const Schema_2x3::IfcConnectedFaceSet& fset, TempMesh& result, ConversionData& conv)
{
    for(const Schema_2x3::IfcFace& face : fset.CfsFaces) {
        // size_t ob = -1, cnt = 0;
        TempMesh meshout;
        for(const Schema_2x3::IfcFaceBound& bound : face.Bounds) {

            if(const Schema_2x3::IfcPolyLoop* const polyloop = bound.Bound->ToPtr<Schema_2x3::IfcPolyLoop>()) {
                if(ProcessPolyloop(*polyloop, meshout,conv)) {

                    // The outer boundary is better determined by checking which
                    // polygon covers the largest area.

                    //if(bound.ToPtr<IfcFaceOuterBound>()) {
                    //  ob = cnt;
                    //}
                    //++cnt;

                }
            }
            else {
                IFCImporter::LogWarn("skipping unknown IfcFaceBound entity, type is " + bound.Bound->GetClassName());
                continue;
            }

            // And this, even though it is sometimes TRUE and sometimes FALSE,
            // does not really improve results.

            /*if(!IsTrue(bound.Orientation)) {
                size_t c = 0;
                for(unsigned int& c : meshout.vertcnt) {
                    std::reverse(result.verts.begin() + cnt,result.verts.begin() + cnt + c);
                    cnt += c;
                }
            }*/
        }
        ProcessPolygonBoundaries(result, meshout);
    }
}